

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.hh
# Opt level: O2

void __thiscall avro::Validator::~Validator(Validator *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x40));
  std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
  ~vector((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_> *)
          (this + 0x28));
  boost::detail::shared_count::~shared_count((shared_count *)(this + 8));
  return;
}

Assistant:

class AVRO_DECL Validator : private boost::noncopyable
{
  public:

    explicit Validator(const ValidSchema &schema);

    void setCount(int64_t val);

    bool typeIsExpected(Type type) const {
        return (expectedTypesFlag_ & typeToFlag(type)) != 0;
    }

    Type nextTypeExpected() const {
        return nextType_;
    }

    int nextSizeExpected() const;

    bool getCurrentRecordName(std::string &name) const;
    bool getNextFieldName(std::string &name) const;

    void checkTypeExpected(Type type) {
        if(! typeIsExpected(type)) {
            throw Exception(
                boost::format("Type %1% does not match schema %2%") 
                    % type % nextType_
            );
        }
        advance();
    }

    void checkFixedSizeExpected(int size) { 
        if( nextSizeExpected() != size) {
            throw Exception(
                boost::format("Wrong size for fixed, got %1%, expected %2%") 
                    % size % nextSizeExpected()
            );
        }
        checkTypeExpected(AVRO_FIXED);
    }

  private:

    typedef uint32_t flag_t;

    flag_t typeToFlag(Type type) const {
        flag_t flag = (1L << type);
        return flag;
    }

    void setupOperation(const NodePtr &node);

    void setWaitingForCount();

    void advance();
    void doAdvance();

    void enumAdvance();
    bool countingSetup();
    void countingAdvance();
    void unionAdvance();
    void fixedAdvance();

    void setupFlag(Type type);

    const ValidSchema schema_;

    Type nextType_; 
    flag_t expectedTypesFlag_;
    bool compoundStarted_;
    bool waitingForCount_;
    int64_t count_;

    struct CompoundType {
        explicit CompoundType(const NodePtr &n) :
            node(n), pos(0)
        {}
        NodePtr node;  ///< save the node
        size_t  pos;   ///< track the leaf position to visit
    };

    std::vector<CompoundType> compoundStack_;
    std::vector<size_t> counters_;

}